

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * adios2sys::SystemTools::GetFilenameWithoutLastExtension
                   (string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  
  GetFilenameName(__return_storage_ptr__,filename);
  lVar1 = std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2e);
  if (lVar1 != -1) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenameWithoutLastExtension(
  const std::string& filename)
{
  std::string name = SystemTools::GetFilenameName(filename);
  std::string::size_type dot_pos = name.rfind('.');
  if (dot_pos != std::string::npos) {
    name.resize(dot_pos);
  }
  return name;
}